

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall
CommandDrawSwitchableImage::CommandDrawSwitchableImage
          (CommandDrawSwitchableImage *this,SBarInfo *script)

{
  CommandDrawImage::CommandDrawImage(&this->super_CommandDrawImage,script);
  (this->super_CommandDrawImage).super_SBarInfoCommandFlowControl.super_SBarInfoCommand.
  _vptr_SBarInfoCommand = (_func_int **)&PTR__CommandDrawSwitchableImage_007e4eb0;
  this->condition = INVENTORY;
  this->conditionAnd = false;
  this->inventoryItem[0].Chars = FString::NullString.Nothing;
  this->inventoryItem[1].Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  this->conditionalValue[1] = 0;
  this->conditionalImage[0] = -1;
  this->conditionalImage[1] = -1;
  *(undefined8 *)(this->conditionalImage + 2) = 0xffffffff;
  this->armorType[0] = 0;
  this->armorType[1] = 0;
  this->keySpecies[0] = 0;
  this->keySpecies[1] = 0;
  return;
}

Assistant:

CommandDrawSwitchableImage(SBarInfo *script) : CommandDrawImage(script),
			condition(INVENTORY), conditionAnd(false)
		{
			conditionalImage[0] = conditionalImage[1] = conditionalImage[2] = -1;
			conditionalValue[0] = conditionalValue[1] = 0;
			armorType[0] = armorType[1] = 0;
		}